

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::PassthroughTestInstance
          (PassthroughTestInstance *this,Context *context,Params *params)

{
  PipelineDescription *pPVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  string *psVar7;
  undefined3 uVar8;
  float fVar9;
  long lVar10;
  bool bVar11;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__PassthroughTestInstance_00d2f5f0;
  uVar8 = *(undefined3 *)&params->field_0x1;
  fVar9 = (params->tessLevels).inner[0];
  uVar3 = *(undefined8 *)((params->tessLevels).inner + 1);
  uVar4 = *(undefined8 *)((params->tessLevels).outer + 1);
  uVar5 = *(undefined8 *)((params->tessLevels).outer + 3);
  (this->m_params).useTessLevels = params->useTessLevels;
  *(undefined3 *)&(this->m_params).field_0x1 = uVar8;
  (this->m_params).tessLevels.inner[0] = fVar9;
  *(undefined8 *)((this->m_params).tessLevels.inner + 1) = uVar3;
  *(undefined8 *)((this->m_params).tessLevels.outer + 1) = uVar4;
  *(undefined8 *)((this->m_params).tessLevels.outer + 3) = uVar5;
  (this->m_params).inputPatchVertices = params->inputPatchVertices;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&(this->m_params).vertices,&params->vertices);
  bVar11 = false;
  lVar10 = 0;
  do {
    bVar6 = params->pipelineCases[lVar10].useGeometry;
    pPVar1 = (this->m_params).pipelineCases + lVar10;
    pPVar1->useTessellation = params->pipelineCases[lVar10].useTessellation;
    pPVar1->useGeometry = bVar6;
    psVar7 = &(this->m_params).pipelineCases[lVar10].tessEvalShaderName;
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    pcVar2 = params->pipelineCases[lVar10].tessEvalShaderName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(this->m_params).pipelineCases[lVar10].tessEvalShaderName,pcVar2,
               pcVar2 + params->pipelineCases[lVar10].tessEvalShaderName._M_string_length);
    (this->m_params).pipelineCases[lVar10].geomShaderName._M_dataplus._M_p =
         (pointer)&(this->m_params).pipelineCases[lVar10].geomShaderName.field_2;
    pcVar2 = params->pipelineCases[lVar10].geomShaderName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(this->m_params).pipelineCases[lVar10].geomShaderName,pcVar2,
               pcVar2 + params->pipelineCases[lVar10].geomShaderName._M_string_length);
    (this->m_params).pipelineCases[lVar10].description._M_dataplus._M_p =
         (pointer)&(this->m_params).pipelineCases[lVar10].description.field_2;
    pcVar2 = params->pipelineCases[lVar10].description._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(this->m_params).pipelineCases[lVar10].description,pcVar2,
               pcVar2 + params->pipelineCases[lVar10].description._M_string_length);
    lVar10 = 1;
    bVar6 = !bVar11;
    bVar11 = true;
  } while (bVar6);
  (this->m_params).message._M_dataplus._M_p = (pointer)&(this->m_params).message.field_2;
  pcVar2 = (params->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_params).message,pcVar2,pcVar2 + (params->message)._M_string_length)
  ;
  return;
}

Assistant:

PassthroughTestInstance	(Context& context, const Params& params) : TestInstance(context), m_params(params) {}